

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix3.hpp
# Opt level: O0

Vector3<double> * __thiscall
OpenMD::SquareMatrix3<double>::toEulerAngles(SquareMatrix3<double> *this)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  double *in_RSI;
  Vector<double,_3U> *in_RDI;
  double stheta;
  double ctheta;
  double psi;
  double theta;
  double phi;
  Vector3<double> *myEuler;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  
  Vector3<double>::Vector3((Vector3<double> *)0x26af7a);
  local_40 = 1.0;
  local_48 = -1.0;
  pdVar3 = std::max<double>(&local_48,in_RSI + 8);
  pdVar3 = std::min<double>(&local_40,pdVar3);
  local_20 = acos(*pdVar3);
  local_30 = in_RSI[8];
  local_38 = sqrt(-local_30 * local_30 + 1.0);
  if (1e-06 <= ABS(local_38)) {
    local_18 = atan2(in_RSI[6],-in_RSI[7]);
    local_28 = atan2(in_RSI[2],in_RSI[5]);
  }
  else {
    local_28 = 0.0;
    local_18 = atan2(-in_RSI[3],*in_RSI);
  }
  if (local_18 < 0.0) {
    local_18 = local_18 + 6.283185307179586;
  }
  dVar1 = local_18;
  if (local_28 < 0.0) {
    local_28 = local_28 + 6.283185307179586;
  }
  pdVar3 = Vector<double,_3U>::operator[](in_RDI,0);
  dVar2 = local_20;
  *pdVar3 = dVar1;
  pdVar3 = Vector<double,_3U>::operator[](in_RDI,1);
  dVar1 = local_28;
  *pdVar3 = dVar2;
  pdVar3 = Vector<double,_3U>::operator[](in_RDI,2);
  *pdVar3 = dVar1;
  return (Vector3<double> *)in_RDI;
}

Assistant:

Vector3<Real> toEulerAngles() {
      Vector3<Real> myEuler;
      Real phi;
      Real theta;
      Real psi;
      Real ctheta;
      Real stheta;

      // set the tolerance for Euler angles and rotation elements

      theta = acos(
          std::min((RealType)1.0, std::max((RealType)-1.0, this->data_[2][2])));
      ctheta = this->data_[2][2];
      stheta = sqrt(1.0 - ctheta * ctheta);

      // when sin(theta) is close to 0, we need to consider
      // singularity In this case, we can assign an arbitary value to
      // phi (or psi), and then determine the psi (or phi) or
      // vice-versa. We'll assume that phi always gets the rotation,
      // and psi is 0 in cases of singularity.
      // we use atan2 instead of atan, since atan2 will give us -Pi to Pi.
      // Since 0 <= theta <= 180, sin(theta) will be always
      // non-negative. Therefore, it will never change the sign of both of
      // the parameters passed to atan2.

      if (fabs(stheta) < 1e-6) {
        psi = 0.0;
        phi = atan2(-this->data_[1][0], this->data_[0][0]);
      }
      // we only have one unique solution
      else {
        phi = atan2(this->data_[2][0], -this->data_[2][1]);
        psi = atan2(this->data_[0][2], this->data_[1][2]);
      }

      // wrap phi and psi, make sure they are in the range from 0 to 2*Pi
      if (phi < 0) phi += 2.0 * Constants::PI;

      if (psi < 0) psi += 2.0 * Constants::PI;

      myEuler[0] = phi;
      myEuler[1] = theta;
      myEuler[2] = psi;

      return myEuler;
    }